

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ForeachLoopListSyntax *args_1;
  SyntaxNode *args_2;
  LoopConstraintSyntax *pLVar1;
  DeepCloneVisitor visitor;
  DeepCloneVisitor local_31;
  Token local_30;
  
  local_30 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  args_1 = (ForeachLoopListSyntax *)
           detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x28),&local_31,(BumpAllocator *)__child_stack);
  args_2 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x30),&local_31,(BumpAllocator *)__child_stack);
  pLVar1 = BumpAllocator::
           emplace<slang::syntax::LoopConstraintSyntax,slang::parsing::Token,slang::syntax::ForeachLoopListSyntax&,slang::syntax::ConstraintItemSyntax&>
                     ((BumpAllocator *)__child_stack,&local_30,args_1,(ConstraintItemSyntax *)args_2
                     );
  return (int)pLVar1;
}

Assistant:

static SyntaxNode* clone(const LoopConstraintSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<LoopConstraintSyntax>(
        node.foreachKeyword.deepClone(alloc),
        *deepClone<ForeachLoopListSyntax>(*node.loopList, alloc),
        *deepClone<ConstraintItemSyntax>(*node.constraints, alloc)
    );
}